

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O1

int testStateFeature_ArrayUsesRangeFlexibleShape_shouldFail(void)

{
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  Rep *pRVar1;
  ulong uVar2;
  SequenceFeatureType *this_00;
  ModelDescription *interface;
  bool bVar3;
  ResultType RVar4;
  FeatureDescription *pFVar5;
  FeatureType *pFVar6;
  StateFeatureType *pSVar7;
  ArrayFeatureType *pAVar8;
  ArrayFeatureType_ShapeRange *pAVar9;
  ostream *poVar10;
  int iVar11;
  Arena *pAVar12;
  ValidationPolicy validationPolicy;
  Model m;
  ValidationPolicy local_7c;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50,(Arena *)0x0,false);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pAVar12 = (Arena *)(local_50.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_50.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar12 = *(Arena **)pAVar12;
    }
    local_50.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar12);
  }
  interface = local_50.description_;
  pRVar1 = ((local_50.description_)->state_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar1 == (Rep *)0x0) {
LAB_0016d874:
    this = &(local_50.description_)->state_;
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((this->super_RepeatedPtrFieldBase).arena_);
    pFVar5 = (FeatureDescription *)
             google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&this->super_RepeatedPtrFieldBase,pFVar5);
  }
  else {
    iVar11 = ((local_50.description_)->state_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar1->allocated_size <= iVar11) goto LAB_0016d874;
    ((local_50.description_)->state_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
    pFVar5 = (FeatureDescription *)pRVar1->elements[iVar11];
  }
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"x","");
  setupStateFeature(pFVar5,(string *)local_78);
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pFVar5->type_ == (FeatureType *)0x0) {
    uVar2 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar12 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar12 = *(Arena **)pAVar12;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar12);
    pFVar5->type_ = pFVar6;
  }
  pFVar6 = pFVar5->type_;
  if (pFVar6->_oneof_case_[0] != 8) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 8;
    uVar2 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar12 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar12 = *(Arena **)pAVar12;
    }
    pSVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StateFeatureType>
                       (pAVar12);
    (pFVar6->Type_).statetype_ = pSVar7;
  }
  this_00 = (pFVar6->Type_).sequencetype_;
  if (*(int *)((long)&this_00->Type_ + 4) != 1) {
    CoreML::Specification::StateFeatureType::clear_Type((StateFeatureType *)this_00);
    *(undefined4 *)((long)&this_00->Type_ + 4) = 1;
    uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar12 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar12 = *(Arena **)pAVar12;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar12);
    this_00->sizerange_ = (SizeRange *)pAVar8;
  }
  pAVar8 = (ArrayFeatureType *)this_00->sizerange_;
  if (pAVar8->_oneof_case_[0] != 0x1f) {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar8);
    pAVar8->_oneof_case_[0] = 0x1f;
    uVar2 = (pAVar8->super_MessageLite)._internal_metadata_.ptr_;
    pAVar12 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar12 = *(Arena **)pAVar12;
    }
    pAVar9 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>(pAVar12);
    (pAVar8->ShapeFlexibility_).shaperange_ = pAVar9;
  }
  local_7c.allowsEmptyInput = true;
  local_7c.allowsEmptyOutput = true;
  local_7c.allowsMultipleFunctions = true;
  local_7c.allowsStatefulPrediction = true;
  CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
  bVar3 = CoreML::Result::good((Result *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1f1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy))).good())"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  else {
    CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
    RVar4 = CoreML::Result::type((Result *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._8_8_ != &local_60) {
      operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
    }
    iVar11 = 0;
    if (RVar4 == INVALID_MODEL_INTERFACE) goto LAB_0016db72;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1f1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy)).type())"
               ,0x94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  std::ostream::put((char)poVar10);
  iVar11 = 1;
  std::ostream::flush();
LAB_0016db72:
  CoreML::Specification::Model::~Model(&local_50);
  return iVar11;
}

Assistant:

int testStateFeature_ArrayUsesRangeFlexibleShape_shouldFail() {
    Specification::Model m;
    auto *description = m.mutable_description();
    auto *state = description->add_state();

    setupStateFeature(state, "x");
    state->mutable_type()->mutable_statetype()->mutable_arraytype()->mutable_shaperange();

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);

    return 0;
}